

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_t<double,double>
               (size_t *ix_arr,size_t st,size_t end,double *x,MissingAction missing_action,
               double *x_sd,double *x_mean)

{
  long lVar1;
  long lVar2;
  double dVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  dVar8 = x[ix_arr[st]];
  if (missing_action != Fail) {
    do {
      if (NAN(dVar8)) {
        if (end < st) goto LAB_0017c6e8;
      }
      else if ((end < st) || (ABS(dVar8) != INFINITY)) goto LAB_0017c6e8;
      lVar4 = st + 1;
      st = st + 1;
      dVar8 = x[ix_arr[lVar4]];
    } while( true );
  }
  dVar12 = 0.0;
  dVar7 = 0.0;
  if (st <= end) {
    dVar12 = 0.0;
    lVar4 = 0;
    do {
      dVar3 = x[ix_arr[st + lVar4]];
      lVar1 = lVar4 + 1;
      auVar10._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar10._0_8_ = lVar1;
      auVar10._12_4_ = 0x45300000;
      dVar12 = (dVar3 - dVar12) /
               ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) + dVar12;
      dVar7 = fma(dVar3 - dVar12,dVar3 - dVar8,dVar7);
      lVar2 = st + lVar4;
      lVar4 = lVar1;
      dVar8 = dVar12;
    } while (lVar2 + 1U <= end);
  }
  *x_mean = dVar12;
  lVar4 = (end - st) + 1;
  auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  dVar7 = dVar7 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
LAB_0017c8b5:
  *x_sd = SQRT(dVar7);
  return;
LAB_0017c6e8:
  if (end < st) {
    dVar7 = NAN;
    dVar12 = 0.0;
  }
  else {
    dVar7 = 0.0;
    lVar4 = 0;
    dVar12 = 0.0;
    do {
      dVar3 = x[ix_arr[st]];
      dVar9 = dVar8;
      if ((ulong)ABS(dVar3) < 0x7ff0000000000000) {
        lVar4 = lVar4 + 1;
        auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar11._0_8_ = lVar4;
        auVar11._12_4_ = 0x45300000;
        dVar9 = dVar12 + (dVar3 - dVar12) /
                         ((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
        dVar7 = fma(dVar3 - dVar9,dVar3 - dVar8,dVar7);
        dVar12 = dVar9;
      }
      st = st + 1;
      dVar8 = dVar9;
    } while (st <= end);
    auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = 0x45300000;
    dVar7 = dVar7 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  }
  *x_mean = dVar12;
  goto LAB_0017c8b5;
}

Assistant:

void calc_mean_and_sd_t(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x,
                        MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = x[ix_arr[st]];
    real_t xval;

    if (missing_action == Fail)
    {
        m_prev = x[ix_arr[st]];
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            m += (xval - m) / (real_t)(row - st + 1);
            s  = std::fma(xval - m, xval - m_prev, s);
            m_prev = m;
        }

        x_mean = m;
        x_sd   = std::sqrt(s / (real_t)(end - st + 1));
    }

    else
    {
        size_t cnt = 0;
        while (is_na_or_inf(m_prev) && st <= end)
        {
            m_prev = x[ix_arr[++st]];
        }

        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            if (likely(!is_na_or_inf(xval)))
            {
                cnt++;
                m += (xval - m) / (real_t)cnt;
                s  = std::fma(xval - m, xval - m_prev, s);
                m_prev = m;
            }
        }

        x_mean = m;
        x_sd   = std::sqrt(s / (real_t)cnt);
    }
}